

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O1

size_t ZSTD_ldm_generateSequences
                 (ldmState_t *ldmState,rawSeqStore_t *sequences,ldmParams_t *params,void *src,
                 size_t srcSize)

{
  BYTE **ppBVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  U32 *pUVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  U32 UVar11;
  ulong uVar12;
  BYTE *pBVar13;
  ldmEntry_t *plVar14;
  U64 UVar15;
  rawSeq *prVar16;
  undefined4 uVar17;
  ldmParams_t ldmParams;
  uint uVar18;
  ulong *puVar19;
  BYTE *pBVar20;
  U32 UVar21;
  uint uVar22;
  uint uVar23;
  U32 UVar24;
  ulong uVar25;
  ulong *puVar26;
  long lVar27;
  bool bVar28;
  uint uVar29;
  int iVar30;
  long lVar31;
  ulong *puVar32;
  ulong uVar33;
  ldmEntry_t *plVar34;
  U32 UVar35;
  ulong *puVar36;
  ulong *puVar37;
  ulong *puVar38;
  ulong *puVar39;
  ulong *puVar40;
  uint uVar41;
  ulong *puVar42;
  ulong *puVar43;
  U32 hBits;
  byte *pbVar44;
  BYTE *pBVar45;
  ulong uVar46;
  U32 u;
  long lVar47;
  byte *pbVar48;
  byte *pbVar49;
  ulong rollingHash;
  ulong *puVar50;
  ulong *puVar51;
  ulong *puVar52;
  size_t sVar53;
  ulong *local_1e0;
  int iStack_16c;
  size_t local_158;
  byte *local_150;
  byte *local_120;
  ulong *local_108;
  ldmEntry_t *local_100;
  byte *local_f0;
  size_t local_e0;
  
  uVar22 = 1 << ((byte)params->windowLog & 0x1f);
  lVar31 = (ulong)((srcSize & 0xfffff) != 0) + (srcSize >> 0x14);
  if (lVar31 != 0) {
    lVar27 = 0;
    local_158 = 0;
    do {
      puVar51 = (ulong *)0x0;
      uVar12 = sequences->size;
      if (sequences->capacity <= uVar12) {
        return 0;
      }
      puVar3 = (ulong *)((long)src + lVar27 * 0x100000);
      puVar52 = puVar3 + 0x20000;
      if (srcSize + lVar27 * -0x100000 < 0x100000) {
        puVar52 = (ulong *)((long)src + srcSize);
      }
      pBVar13 = (ldmState->window).base;
      iVar30 = (int)pBVar13;
      if (0xe0000000 < (uint)((int)puVar52 - iVar30)) {
        UVar21 = params->hashLog;
        uVar29 = ((int)src - iVar30) - uVar22;
        (ldmState->window).base = pBVar13 + uVar29;
        ppBVar1 = &(ldmState->window).dictBase;
        *ppBVar1 = *ppBVar1 + uVar29;
        uVar6 = (ldmState->window).dictLimit;
        uVar7 = (ldmState->window).lowLimit;
        (ldmState->window).dictLimit = uVar6 - uVar29;
        (ldmState->window).lowLimit = uVar7 - uVar29;
        plVar14 = ldmState->hashTable;
        lVar47 = 0;
        do {
          uVar23 = plVar14[lVar47].offset;
          UVar35 = uVar23 - uVar29;
          if (uVar23 < uVar29) {
            UVar35 = 0;
          }
          plVar14[lVar47].offset = UVar35;
          lVar47 = lVar47 + 1;
        } while (1L << ((byte)UVar21 & 0x3f) != lVar47);
      }
      pBVar13 = (ldmState->window).base;
      iVar30 = (int)pBVar13;
      uVar29 = (int)puVar52 - iVar30;
      uVar23 = uVar29 - uVar22;
      if (uVar22 <= uVar29 && uVar23 != 0) {
        if ((ldmState->window).lowLimit < uVar23) {
          (ldmState->window).lowLimit = uVar23;
        }
        uVar29 = (ldmState->window).lowLimit;
        if ((ldmState->window).dictLimit < uVar29) {
          (ldmState->window).dictLimit = uVar29;
        }
      }
      UVar21 = params->bucketSizeLog;
      uVar29 = (ldmState->window).dictLimit;
      uVar23 = params->hashEveryLog;
      uVar8 = (ldmState->window).lowLimit;
      UVar35 = params->hashLog;
      uVar9 = params->minMatchLength;
      pbVar44 = (byte *)(ulong)uVar9;
      UVar15 = ldmState->hashPower;
      if (uVar8 < uVar29) {
        pBVar45 = (ldmState->window).dictBase;
        uVar18 = uVar8;
      }
      else {
        pBVar45 = (BYTE *)0x0;
        uVar18 = uVar29;
      }
      puVar38 = (ulong *)(pBVar45 + uVar29);
      puVar19 = (ulong *)(pBVar45 + uVar18);
      if (uVar29 <= uVar8) {
        puVar38 = puVar51;
        puVar19 = puVar51;
      }
      pbVar48 = (byte *)0x8;
      if (8 < uVar9) {
        pbVar48 = pbVar44;
      }
      puVar32 = (ulong *)(((long)puVar52 - (long)puVar3) + (long)puVar3);
      puVar42 = (ulong *)((long)puVar32 - (long)pbVar48);
      local_1e0 = puVar3;
      if (puVar3 <= puVar42) {
        hBits = UVar35 - UVar21;
        puVar4 = (ulong *)(pBVar13 + uVar29);
        uVar41 = 0x20 - hBits;
        puVar2 = (ulong *)((long)puVar32 - 7);
        puVar43 = (ulong *)(ulong)(uVar41 - uVar23);
        if (uVar41 < uVar23) {
          puVar43 = puVar51;
        }
        rollingHash = 0;
        puVar26 = (ulong *)0x0;
        puVar50 = puVar3;
        do {
          if (puVar50 == puVar3) {
            if (uVar9 == 0) {
              rollingHash = 0;
            }
            else {
              pbVar48 = (byte *)0x0;
              rollingHash = 0;
              do {
                rollingHash = rollingHash * -0x30e44323485a9b9d +
                              (ulong)*(byte *)((long)puVar50 + (long)pbVar48) + 10;
                pbVar48 = pbVar48 + 1;
              } while (pbVar44 != pbVar48);
            }
          }
          else {
            rollingHash = (rollingHash - ((ulong)(byte)*puVar26 + 10) * UVar15) *
                          -0x30e44323485a9b9d + (ulong)*(byte *)((long)puVar26 + (long)pbVar44) + 10
            ;
          }
          if (((uint)(rollingHash >> ((byte)puVar43 & 0x3f)) | -1 << ((byte)uVar23 & 0x1f)) ==
              0xffffffff) {
            UVar24 = (int)puVar50 - iVar30;
            uVar33 = rollingHash >> (0x40U - (char)hBits & 0x3f) & 0xffffffff;
            if (UVar35 == UVar21) {
              uVar33 = 0;
            }
            plVar34 = ldmState->hashTable + (uVar33 << ((byte)params->bucketSizeLog & 0x3f));
            plVar14 = plVar34 + (1L << ((byte)UVar21 & 0x3f));
            local_120 = (byte *)0x0;
            local_108 = (ulong *)0x0;
            local_100 = (ldmEntry_t *)0x0;
            local_f0 = (byte *)0x0;
            do {
              if (plVar34->checksum == (U32)(rollingHash >> ((byte)uVar41 & 0x3f))) {
                uVar10 = plVar34->offset;
                if (uVar18 < uVar10) {
                  if (uVar8 < uVar29) {
                    puVar26 = puVar32;
                    pBVar20 = pBVar13;
                    if (uVar10 < uVar29) {
                      puVar26 = puVar38;
                      pBVar20 = pBVar45;
                    }
                    puVar40 = (ulong *)(pBVar20 + uVar10);
                    puVar37 = (ulong *)(((long)puVar26 - (long)puVar40) + (long)puVar50);
                    if (puVar52 <= puVar37) {
                      puVar37 = puVar32;
                    }
                    puVar36 = puVar50;
                    puVar39 = puVar40;
                    if (puVar50 < (ulong *)((long)puVar37 - 7U)) {
                      uVar46 = *puVar50 ^ *puVar40;
                      uVar33 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                        }
                      }
                      pbVar48 = (byte *)(uVar33 >> 3 & 0x1fffffff);
                      puVar36 = puVar50 + 1;
                      if (*puVar40 == *puVar50) {
                        do {
                          puVar39 = puVar39 + 1;
                          if ((ulong *)((long)puVar37 - 7U) <= puVar36) goto LAB_00170488;
                          uVar33 = *puVar36;
                          uVar25 = uVar33 ^ *puVar39;
                          uVar46 = 0;
                          if (uVar25 != 0) {
                            for (; (uVar25 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                            }
                          }
                          pbVar48 = (byte *)((long)puVar36 +
                                            ((uVar46 >> 3 & 0x1fffffff) - (long)puVar50));
                          puVar36 = puVar36 + 1;
                        } while (*puVar39 == uVar33);
                      }
                    }
                    else {
LAB_00170488:
                      if ((puVar36 < (ulong *)((long)puVar37 - 3U)) &&
                         ((int)*puVar39 == (int)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 4);
                        puVar39 = (ulong *)((long)puVar39 + 4);
                      }
                      if ((puVar36 < (ulong *)((long)puVar37 - 1U)) &&
                         ((short)*puVar39 == (short)*puVar36)) {
                        puVar36 = (ulong *)((long)puVar36 + 2);
                        puVar39 = (ulong *)((long)puVar39 + 2);
                      }
                      if (puVar36 < puVar37) {
                        puVar36 = (ulong *)((long)puVar36 +
                                           (ulong)((byte)*puVar39 == (byte)*puVar36));
                      }
                      pbVar48 = (byte *)((long)puVar36 - (long)puVar50);
                    }
                    if ((ulong *)((long)puVar40 + (long)pbVar48) == puVar26) {
                      puVar26 = (ulong *)(pbVar48 + (long)puVar50);
                      puVar37 = puVar26;
                      puVar39 = puVar4;
                      if (puVar26 < puVar2) {
                        uVar46 = *puVar26 ^ *puVar4;
                        uVar33 = 0;
                        if (uVar46 != 0) {
                          for (; (uVar46 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                          }
                        }
                        pbVar49 = (byte *)(uVar33 >> 3 & 0x1fffffff);
                        if (*puVar4 == *puVar26) {
                          do {
                            puVar39 = puVar39 + 1;
                            puVar37 = puVar37 + 1;
                            if (puVar2 <= puVar37) goto LAB_00170628;
                            uVar46 = *puVar37 ^ *puVar39;
                            uVar33 = 0;
                            if (uVar46 != 0) {
                              for (; (uVar46 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                              }
                            }
                            pbVar49 = (byte *)((long)puVar37 +
                                              ((uVar33 >> 3 & 0x1fffffff) - (long)puVar26));
                          } while (*puVar39 == *puVar37);
                        }
                      }
                      else {
LAB_00170628:
                        if ((puVar37 < (ulong *)((long)puVar32 - 3U)) &&
                           ((int)*puVar39 == (int)*puVar37)) {
                          puVar37 = (ulong *)((long)puVar37 + 4);
                          puVar39 = (ulong *)((long)puVar39 + 4);
                        }
                        if ((puVar37 < (ulong *)((long)puVar32 + -1)) &&
                           ((short)*puVar39 == (short)*puVar37)) {
                          puVar37 = (ulong *)((long)puVar37 + 2);
                          puVar39 = (ulong *)((long)puVar39 + 2);
                        }
                        if (puVar37 < puVar52) {
                          puVar37 = (ulong *)((long)puVar37 +
                                             (ulong)((byte)*puVar39 == (byte)*puVar37));
                        }
                        pbVar49 = (byte *)((long)puVar37 - (long)puVar26);
                      }
                      pbVar48 = pbVar48 + (long)pbVar49;
                    }
                    if (pbVar44 <= pbVar48) {
                      puVar26 = puVar4;
                      if (uVar10 < uVar29) {
                        puVar26 = puVar19;
                      }
                      if (local_1e0 < puVar50) {
                        puVar51 = (ulong *)0x0;
                        if (puVar26 < puVar40) {
                          puVar37 = (ulong *)(pBVar20 + uVar10);
                          puVar51 = (ulong *)0x0;
                          puVar40 = (ulong *)((long)puVar50 + -1);
                          do {
                            puVar37 = (ulong *)((long)puVar37 + -1);
                            if (((byte)*puVar40 != *(byte *)puVar37) ||
                               (puVar51 = (ulong *)((long)puVar51 + 1), puVar40 <= local_1e0))
                            break;
                            puVar40 = (ulong *)((long)puVar40 + -1);
                          } while (puVar26 < puVar37);
                        }
                      }
                      else {
LAB_001706fa:
                        puVar51 = (ulong *)0x0;
                      }
LAB_001706fd:
                      local_150 = (byte *)((long)puVar51 + (long)pbVar48);
                    }
                  }
                  else {
                    puVar40 = (ulong *)(pBVar13 + uVar10);
                    puVar26 = puVar50;
                    if (puVar50 < puVar2) {
                      uVar46 = *puVar50 ^ *puVar40;
                      uVar33 = 0;
                      if (uVar46 != 0) {
                        for (; (uVar46 >> uVar33 & 1) == 0; uVar33 = uVar33 + 1) {
                        }
                      }
                      pbVar48 = (byte *)(uVar33 >> 3 & 0x1fffffff);
                      puVar26 = puVar50 + 1;
                      if (*puVar40 == *puVar50) {
                        do {
                          puVar40 = puVar40 + 1;
                          if (puVar2 <= puVar26) goto LAB_00170574;
                          uVar33 = *puVar26;
                          uVar25 = uVar33 ^ *puVar40;
                          uVar46 = 0;
                          if (uVar25 != 0) {
                            for (; (uVar25 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                            }
                          }
                          pbVar48 = (byte *)((long)puVar26 +
                                            ((uVar46 >> 3 & 0x1fffffff) - (long)puVar50));
                          puVar26 = puVar26 + 1;
                        } while (*puVar40 == uVar33);
                      }
                    }
                    else {
LAB_00170574:
                      if ((puVar26 < (ulong *)((long)puVar32 - 3U)) &&
                         ((int)*puVar40 == (int)*puVar26)) {
                        puVar26 = (ulong *)((long)puVar26 + 4);
                        puVar40 = (ulong *)((long)puVar40 + 4);
                      }
                      if ((puVar26 < (ulong *)((long)puVar32 + -1)) &&
                         ((short)*puVar40 == (short)*puVar26)) {
                        puVar26 = (ulong *)((long)puVar26 + 2);
                        puVar40 = (ulong *)((long)puVar40 + 2);
                      }
                      if (puVar26 < puVar52) {
                        puVar26 = (ulong *)((long)puVar26 +
                                           (ulong)((byte)*puVar40 == (byte)*puVar26));
                      }
                      pbVar48 = (byte *)((long)puVar26 - (long)puVar50);
                    }
                    if (pbVar44 <= pbVar48) {
                      if (puVar50 <= local_1e0) goto LAB_001706fa;
                      puVar51 = (ulong *)0x0;
                      if (uVar29 < uVar10) {
                        puVar51 = (ulong *)0x0;
                        puVar26 = (ulong *)((long)puVar50 + -1);
                        puVar40 = (ulong *)(pBVar13 + ((ulong)uVar10 - 1));
                        do {
                          if (((byte)*puVar26 != (byte)*puVar40) ||
                             (puVar51 = (ulong *)((long)puVar51 + 1), puVar26 <= local_1e0)) break;
                          puVar26 = (ulong *)((long)puVar26 + -1);
                          bVar28 = puVar4 < puVar40;
                          puVar40 = (ulong *)((long)puVar40 + -1);
                        } while (bVar28);
                      }
                      goto LAB_001706fd;
                    }
                  }
                  if ((pbVar44 <= pbVar48) && (local_f0 < local_150)) {
                    local_120 = pbVar48;
                    local_108 = puVar51;
                    local_100 = plVar34;
                    local_f0 = local_150;
                  }
                }
              }
              plVar34 = plVar34 + 1;
            } while (plVar34 < plVar14);
            if (local_100 == (ldmEntry_t *)0x0) {
              ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar24,*params);
              puVar40 = (ulong *)((long)puVar50 + 1);
              bVar28 = false;
            }
            else {
              puVar40 = (ulong *)((long)puVar50 - (long)local_108);
              sVar53 = sequences->size;
              bVar28 = true;
              if (sVar53 != sequences->capacity) {
                prVar16 = sequences->seq;
                UVar11 = local_100->offset;
                prVar16[sVar53].litLength = (int)puVar40 - (int)local_1e0;
                prVar16[sVar53].matchLength = (int)local_108 + (int)local_120;
                prVar16[sVar53].offset = UVar24 - UVar11;
                sequences->size = sVar53 + 1;
                ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar24,*params);
                puVar40 = (ulong *)((long)puVar50 + (long)local_120);
                bVar28 = false;
                local_1e0 = puVar40;
                if (puVar40 <= puVar42) {
                  uVar17 = params->minMatchLength;
                  ldmParams = *params;
                  if (1 < (long)local_120) {
                    local_120 = local_120 + -1;
                    UVar24 = (1 - iVar30) + (int)puVar50;
                    do {
                      rollingHash = (rollingHash -
                                    ((ulong)(byte)*puVar50 + 10) * ldmState->hashPower) *
                                    -0x30e44323485a9b9d +
                                    (ulong)*(byte *)((long)puVar50 + (ulong)(uVar17 - 1) + 1) + 10;
                      ZSTD_ldm_makeEntryAndInsertByTag(ldmState,rollingHash,hBits,UVar24,ldmParams);
                      puVar50 = (ulong *)((long)puVar50 + 1);
                      UVar24 = UVar24 + 1;
                      local_120 = local_120 + -1;
                    } while (local_120 != (byte *)0x0);
                  }
                  puVar50 = (ulong *)((long)puVar40 + -1);
                  bVar28 = false;
                }
              }
            }
          }
          else {
            puVar40 = (ulong *)((long)puVar50 + 1);
            bVar28 = false;
          }
          if (bVar28) {
            sVar53 = 0xffffffffffffffba;
            goto LAB_001700b8;
          }
          puVar26 = puVar50;
          puVar50 = puVar40;
        } while (puVar40 <= puVar42);
      }
      sVar53 = (long)puVar52 - (long)local_1e0;
LAB_001700b8:
      uVar29 = ZSTD_isError(sVar53);
      if (uVar29 == 0) {
        if (uVar12 < sequences->size) {
          pUVar5 = &sequences->seq[uVar12].litLength;
          *pUVar5 = *pUVar5 + (int)local_158;
          local_158 = sVar53;
          sVar53 = local_e0;
        }
        else {
          local_158 = local_158 + ((long)puVar52 - (long)puVar3);
          sVar53 = local_e0;
        }
      }
      local_e0 = sVar53;
      if (uVar29 != 0) {
        return local_e0;
      }
      lVar27 = lVar27 + 1;
    } while (lVar27 != lVar31);
  }
  return 0;
}

Assistant:

size_t ZSTD_ldm_generateSequences(
        ldmState_t* ldmState, rawSeqStore_t* sequences,
        ldmParams_t const* params, void const* src, size_t srcSize)
{
    U32 const maxDist = 1U << params->windowLog;
    BYTE const* const istart = (BYTE const*)src;
    BYTE const* const iend = istart + srcSize;
    size_t const kMaxChunkSize = 1 << 20;
    size_t const nbChunks = (srcSize / kMaxChunkSize) + ((srcSize % kMaxChunkSize) != 0);
    size_t chunk;
    size_t leftoverSize = 0;

    assert(ZSTD_CHUNKSIZE_MAX >= kMaxChunkSize);
    /* Check that ZSTD_window_update() has been called for this chunk prior
     * to passing it to this function.
     */
    assert(ldmState->window.nextSrc >= (BYTE const*)src + srcSize);
    /* The input could be very large (in zstdmt), so it must be broken up into
     * chunks to enforce the maximmum distance and handle overflow correction.
     */
    assert(sequences->pos <= sequences->size);
    assert(sequences->size <= sequences->capacity);
    for (chunk = 0; chunk < nbChunks && sequences->size < sequences->capacity; ++chunk) {
        BYTE const* const chunkStart = istart + chunk * kMaxChunkSize;
        size_t const remaining = (size_t)(iend - chunkStart);
        BYTE const *const chunkEnd =
            (remaining < kMaxChunkSize) ? iend : chunkStart + kMaxChunkSize;
        size_t const chunkSize = chunkEnd - chunkStart;
        size_t newLeftoverSize;
        size_t const prevSize = sequences->size;

        assert(chunkStart < iend);
        /* 1. Perform overflow correction if necessary. */
        if (ZSTD_window_needOverflowCorrection(ldmState->window, chunkEnd)) {
            U32 const ldmHSize = 1U << params->hashLog;
            U32 const correction = ZSTD_window_correctOverflow(
                &ldmState->window, /* cycleLog */ 0, maxDist, src);
            ZSTD_ldm_reduceTable(ldmState->hashTable, ldmHSize, correction);
        }
        /* 2. We enforce the maximum offset allowed.
         *
         * kMaxChunkSize should be small enough that we don't lose too much of
         * the window through early invalidation.
         * TODO: * Test the chunk size.
         *       * Try invalidation after the sequence generation and test the
         *         the offset against maxDist directly.
         */
        ZSTD_window_enforceMaxDist(&ldmState->window, chunkEnd, maxDist, NULL);
        /* 3. Generate the sequences for the chunk, and get newLeftoverSize. */
        newLeftoverSize = ZSTD_ldm_generateSequences_internal(
            ldmState, sequences, params, chunkStart, chunkSize);
        if (ZSTD_isError(newLeftoverSize))
            return newLeftoverSize;
        /* 4. We add the leftover literals from previous iterations to the first
         *    newly generated sequence, or add the `newLeftoverSize` if none are
         *    generated.
         */
        /* Prepend the leftover literals from the last call */
        if (prevSize < sequences->size) {
            sequences->seq[prevSize].litLength += (U32)leftoverSize;
            leftoverSize = newLeftoverSize;
        } else {
            assert(newLeftoverSize == chunkSize);
            leftoverSize += chunkSize;
        }
    }
    return 0;
}